

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall r_exec::_GMonitor::invalidate_sim_outcomes(_GMonitor *this)

{
  bool bVar1;
  reference ppVar2;
  Sim *pSVar3;
  iterator local_98;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_90;
  iterator local_88;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_80;
  iterator local_78;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_70;
  iterator local_68;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_60;
  iterator local_58;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_50;
  iterator local_48;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_40;
  iterator local_38;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_30;
  iterator local_28;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_20;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_18;
  const_iterator sol;
  _GMonitor *this_local;
  
  sol._M_node = (_List_node_base *)this;
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->sim_failures).mandatory_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->sim_failures).mandatory_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_18);
    pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
    Sim::invalidate(pSVar3);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_18);
  }
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->sim_failures).optional_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_40,&local_48);
  local_18._M_node = local_40._M_node;
  while( true ) {
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->sim_failures).optional_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_50,&local_58);
    bVar1 = std::operator!=(&local_18,&local_50);
    if (!bVar1) break;
    ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_18);
    pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
    Sim::invalidate(pSVar3);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_18);
  }
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->sim_successes).mandatory_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_60,&local_68);
  local_18._M_node = local_60._M_node;
  while( true ) {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->sim_successes).mandatory_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_70,&local_78);
    bVar1 = std::operator!=(&local_18,&local_70);
    if (!bVar1) break;
    ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_18);
    pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
    Sim::invalidate(pSVar3);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_18);
  }
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->sim_successes).optional_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_80,&local_88);
  local_18._M_node = local_80._M_node;
  while( true ) {
    local_98._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->sim_successes).optional_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_90,&local_98);
    bVar1 = std::operator!=(&local_18,&local_90);
    if (!bVar1) break;
    ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_18);
    pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
    Sim::invalidate(pSVar3);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_18);
  }
  return;
}

Assistant:

void _GMonitor::invalidate_sim_outcomes()
{
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }
}